

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

BlockStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BlockStatementSyntax,slang::syntax::BlockStatementSyntax_const&>
          (BumpAllocator *this,BlockStatementSyntax *args)

{
  BlockStatementSyntax *this_00;
  
  this_00 = (BlockStatementSyntax *)allocate(this,0xc0,8);
  slang::syntax::BlockStatementSyntax::BlockStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }